

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

int __thiscall
CVmObjLookupTable::set_index_val_q
          (CVmObjLookupTable *this,vm_val_t *new_container,vm_obj_id_t self,vm_val_t *index_val,
          vm_val_t *new_val)

{
  vm_lookup_val *entry;
  CVmObjLookupTable *this_00;
  
  this_00 = this;
  entry = find_entry(this,index_val,(uint *)0x0,(vm_lookup_val **)0x0);
  if (entry == (vm_lookup_val *)0x0) {
    add_entry_undo(this,self,index_val,new_val);
  }
  else {
    set_entry_val_undo(this_00,self,entry,new_val);
  }
  new_container->typ = VM_OBJ;
  (new_container->val).obj = self;
  return 1;
}

Assistant:

int CVmObjLookupTable::set_index_val_q(VMG_ vm_val_t *new_container,
                                       vm_obj_id_t self,
                                       const vm_val_t *index_val,
                                       const vm_val_t *new_val)
{
    vm_lookup_val *entry;
    
    /* look for an existing entry with this key */
    entry = find_entry(vmg_ index_val, 0, 0);

    /* if we found an existing entry, modify it; otherwise, add a new one */
    if (entry != 0)
    {   
        /* set the new value for this entry */
        set_entry_val_undo(vmg_ self, entry, new_val);
    }
    else
    {
        /* add a new entry with the given key */
        add_entry_undo(vmg_ self, index_val, new_val);
    }

    /* we can be modified, hence the new container is the original one */
    new_container->set_obj(self);

    /* handled */
    return TRUE;
}